

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

EnumDescriptorProto *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>(Arena *arena)

{
  EnumDescriptorProto *this;
  
  if (arena == (Arena *)0x0) {
    this = (EnumDescriptorProto *)operator_new(0x70);
    EnumDescriptorProto::EnumDescriptorProto(this);
  }
  else {
    if (*(long *)(arena + 0x70) != 0) {
      OnArenaAllocation(arena,(type_info *)&EnumDescriptorProto::typeinfo,0x70);
    }
    this = (EnumDescriptorProto *)internal::ArenaImpl::AllocateAligned((ArenaImpl *)arena,0x70);
    EnumDescriptorProto::EnumDescriptorProto(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}